

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternTypeInfo,_false,_false>::grow_and_add
          (FastVector<ExternTypeInfo,_false,_false> *this,uint newSize,ExternTypeInfo *val)

{
  uint uVar1;
  uint uVar2;
  ExternTypeInfo *ptr;
  uint oldMax;
  ExternTypeInfo *oldData;
  ExternTypeInfo *val_local;
  uint newSize_local;
  FastVector<ExternTypeInfo,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  memcpy(this->data + uVar2,val,0x50);
  if (ptr != (ExternTypeInfo *)0x0) {
    NULLC::destruct<ExternTypeInfo>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}